

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

bool __thiscall ExecutorX86::SetStackSize(ExecutorX86 *this,uint bytes)

{
  char *pcVar1;
  byte bVar2;
  
  bVar2 = (this->instList).count != 0 | this->codeRunning;
  if (bVar2 == 0) {
    this->minStackSize = bytes;
    mprotect((void *)(((ulong)(this->vmState).dataStackEnd & 0xfffffffffffff000) + 0x1000),0x1000,3)
    ;
    (*(code *)NULLC::dealloc)((this->vmState).dataStackBase);
    pcVar1 = (char *)(*(code *)NULLC::alloc)(this->minStackSize + 0x2000);
    (this->vmState).dataStackBase = pcVar1;
    NULLC::fillMemory(pcVar1,0,(ulong)this->minStackSize);
    pcVar1 = (this->vmState).dataStackBase + this->minStackSize;
    (this->vmState).dataStackEnd = pcVar1;
    mprotect((void *)(((ulong)pcVar1 & 0xfffffffffffff000) + 0x1000),0x1000,0);
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool ExecutorX86::SetStackSize(unsigned bytes)
{
	if(codeRunning || !instList.empty())
		return false;

	minStackSize = bytes;

	NULLC::AllowMemoryPageRead(vmState.dataStackEnd);

	NULLC::dealloc(vmState.dataStackBase);

	vmState.dataStackBase = (char*)NULLC::alloc(sizeof(char) * minStackSize + 8192); // Two extra pages for page guard
	NULLC::fillMemory(vmState.dataStackBase, 0, sizeof(char) * minStackSize);
	vmState.dataStackEnd = vmState.dataStackBase + minStackSize;

	NULLC::DenyMemoryPageRead(vmState.dataStackEnd);

	return true;
}